

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

void rfc5444_writer_register_pkthandler(rfc5444_writer *writer,rfc5444_writer_pkthandler *pkt)

{
  list_entity *plVar1;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    plVar1 = (writer->_pkthandlers).prev;
    (pkt->_pkthandle_node).next = &writer->_pkthandlers;
    (pkt->_pkthandle_node).prev = plVar1;
    (writer->_pkthandlers).prev = &pkt->_pkthandle_node;
    plVar1->next = &pkt->_pkthandle_node;
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x1fa,
                "void rfc5444_writer_register_pkthandler(struct rfc5444_writer *, struct rfc5444_writer_pkthandler *)"
               );
}

Assistant:

void
rfc5444_writer_register_pkthandler(struct rfc5444_writer *writer, struct rfc5444_writer_pkthandler *pkt) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  list_add_tail(&writer->_pkthandlers, &pkt->_pkthandle_node);
}